

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O0

void __thiscall
adios2::core::engine::BP5Writer::TwoLevelAggregationMetadata(BP5Writer *this,TimestepInfo *TSInfo)

{
  initializer_list<adios2::core::iovec> __l;
  initializer_list<adios2::core::iovec> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  bool bVar1;
  int iVar2;
  int iVar3;
  element_type *peVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  pointer piVar5;
  long in_RSI;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *in_RDI;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> Metadata_1;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> AttributeBlocks_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> DataSizes_1;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  UniqueMetaMetaBlocks_1;
  unsigned_long *n_1;
  iterator __end5;
  iterator __begin5;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range5;
  uint64_t TotalSize_1;
  string meta2_gather_str;
  size_t LocalSize_1;
  vector<unsigned_long,_std::allocator<unsigned_long>_> RecvCounts_1;
  vector<char,_std::allocator<char>_> *buf;
  vector<char,_std::allocator<char>_> RecvBuffer_1;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> Metadata;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> AttributeBlocks;
  vector<unsigned_long,_std::allocator<unsigned_long>_> WriterDataPositions;
  vector<unsigned_long,_std::allocator<unsigned_long>_> DataSizes;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  UniqueMetaMetaBlocks;
  unsigned_long *n;
  iterator __end4;
  iterator __begin4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__range4;
  uint64_t TotalSize;
  vector<char,_std::allocator<char>_> RecvBuffer;
  vector<unsigned_long,_std::allocator<unsigned_long>_> RecvCounts;
  size_t LocalSize;
  string meta1_gather_str;
  iovec a;
  iovec m;
  vector<char,_std::allocator<char>_> MetaBuffer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8c0;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffff8c8;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *in_stack_fffffffffffff8d0;
  allocator *paVar6;
  string *in_stack_fffffffffffff8d8;
  BP5Writer *in_stack_fffffffffffff8e0;
  allocator_type *in_stack_fffffffffffff8e8;
  int rankDestination;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *in_stack_fffffffffffff8f0;
  string *in_stack_fffffffffffff8f8;
  JSONProfiler *in_stack_fffffffffffff900;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *in_stack_fffffffffffff908;
  int __val;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *__x;
  undefined4 in_stack_fffffffffffff910;
  undefined4 in_stack_fffffffffffff914;
  undefined8 in_stack_fffffffffffff9b0;
  undefined1 trace;
  string *in_stack_fffffffffffff9b8;
  JSONProfiler *in_stack_fffffffffffff9c0;
  undefined8 in_stack_fffffffffffff9d0;
  unsigned_long *in_stack_fffffffffffff9d8;
  BP5Writer *in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffffa08;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *UniqueMetaMetaBlocks_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *Counts;
  vector<char,_std::allocator<char>_> *Aggregate;
  BP5Serializer *this_01;
  pointer *MetaDataBlocks;
  BP5Writer *this_02;
  allocator local_5a1;
  string local_5a0 [8];
  char *in_stack_fffffffffffffa68;
  size_t in_stack_fffffffffffffa70;
  size_t *in_stack_fffffffffffffa78;
  size_t in_stack_fffffffffffffa80;
  char *in_stack_fffffffffffffa88;
  Comm *in_stack_fffffffffffffa90;
  int in_stack_fffffffffffffaa0;
  undefined1 local_551 [177];
  string local_4a0 [32];
  reference local_480;
  unsigned_long *local_478;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_470;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffb98;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *in_stack_fffffffffffffba0;
  vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *in_stack_fffffffffffffba8;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *in_stack_fffffffffffffbb0;
  BP5Serializer *in_stack_fffffffffffffbb8;
  string local_440 [16];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffbd0;
  string local_420 [32];
  string local_400 [32];
  size_type local_3e0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_3d8;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  *local_3c0;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  local_3b8;
  allocator local_399;
  string local_398 [39];
  allocator local_371;
  string local_370 [152];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8 [2];
  string local_290 [32];
  reference local_270;
  unsigned_long *local_268;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_260;
  string *local_258;
  long local_250;
  string local_230;
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [39];
  undefined1 local_1a9 [25];
  undefined1 local_190 [32];
  pointer local_170;
  pointer *local_168;
  undefined8 local_160;
  undefined1 local_139 [25];
  undefined8 local_120;
  undefined1 local_f9 [25];
  undefined8 local_e0;
  undefined8 local_90;
  size_t local_88;
  undefined1 local_80 [8];
  size_t sStack_78;
  undefined8 local_70;
  size_t sStack_68;
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  local_60;
  undefined1 local_31 [49];
  
  trace = (undefined1)((ulong)in_stack_fffffffffffff9b0 >> 0x38);
  MetaDataBlocks =
       &in_RDI[0x7a].super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage;
  this_02 = (BP5Writer *)local_31;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_31 + 1),"ES_meta1",(allocator *)this_02);
  profiling::JSONProfiler::Start
            ((JSONProfiler *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
  std::__cxx11::string::~string((string *)(local_31 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_31);
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0xa892ce);
  peVar4 = std::
           __shared_ptr_access<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0xa892df);
  local_70._0_4_ = (*peVar4->_vptr_Buffer[2])();
  local_70._4_4_ = extraout_var;
  peVar4 = std::
           __shared_ptr_access<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0xa89301);
  sStack_68 = peVar4->m_FixedSize;
  memset(local_f9 + 0x79,0,0x10);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(in_RSI + 0x28));
  if (bVar1) {
    peVar4 = std::
             __shared_ptr_access<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0xa8934c);
    local_90._0_4_ = (*peVar4->_vptr_Buffer[2])();
    local_90._4_4_ = extraout_var_00;
    peVar4 = std::
             __shared_ptr_access<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<adios2::format::Buffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0xa8936e);
    local_88 = peVar4->m_FixedSize;
    local_80 = (undefined1  [8])local_90;
    sStack_78 = local_88;
  }
  std::
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ::vector((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
            *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
           in_stack_fffffffffffff908);
  local_f9._1_8_ = local_70;
  local_f9._9_8_ = sStack_68;
  local_f9._17_8_ = local_f9 + 1;
  local_e0 = 1;
  this_01 = (BP5Serializer *)local_f9;
  std::allocator<adios2::core::iovec>::allocator((allocator<adios2::core::iovec> *)0xa89453);
  __l._M_len = (size_type)in_stack_fffffffffffff900;
  __l._M_array = (iterator)in_stack_fffffffffffff8f8;
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::vector
            (in_stack_fffffffffffff8f0,__l,(allocator_type *)in_stack_fffffffffffff8e8);
  local_139._1_8_ = local_80;
  local_139._9_8_ = sStack_78;
  local_139._17_8_ = local_139 + 1;
  local_120 = 1;
  Aggregate = (vector<char,_std::allocator<char>_> *)local_139;
  std::allocator<adios2::core::iovec>::allocator((allocator<adios2::core::iovec> *)0xa894bb);
  __l_00._M_len = (size_type)in_stack_fffffffffffff900;
  __l_00._M_array = (iterator)in_stack_fffffffffffff8f8;
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::vector
            (in_stack_fffffffffffff8f0,__l_00,(allocator_type *)in_stack_fffffffffffff8e8);
  local_170 = in_RDI[0x81].
              super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>._M_impl.
              super__Vector_impl_data._M_finish;
  local_168 = &local_170;
  local_160 = 1;
  Counts = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(local_190 + 0x1f);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xa8952a);
  __l_01._M_len = (size_type)in_stack_fffffffffffff900;
  __l_01._M_array = (iterator)in_stack_fffffffffffff8f8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8f0,
             __l_01,in_stack_fffffffffffff8e8);
  local_1a9._1_8_ =
       in_RDI[0x80].super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_1a9._9_8_ = local_1a9 + 1;
  local_1a9._17_8_ = 1;
  UniqueMetaMetaBlocks_00 =
       (vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
        *)local_1a9;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0xa89599);
  __l_02._M_len = (size_type)in_stack_fffffffffffff900;
  __l_02._M_array = (iterator)in_stack_fffffffffffff8f8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8f0,
             __l_02,in_stack_fffffffffffff8e8);
  this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_190;
  adios2::format::BP5Serializer::CopyMetadataToContiguous
            (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
             in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffbd0);
  std::vector<char,_std::allocator<char>_>::operator=
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff8d0,
             in_stack_fffffffffffff8c8);
  std::vector<char,_std::allocator<char>_>::~vector
            ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff8d0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8d0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xa89649);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8d0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0xa89663);
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~vector
            (in_stack_fffffffffffff8d0);
  std::allocator<adios2::core::iovec>::~allocator((allocator<adios2::core::iovec> *)0xa8967d);
  std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~vector
            (in_stack_fffffffffffff8d0);
  std::allocator<adios2::core::iovec>::~allocator((allocator<adios2::core::iovec> *)0xa89697);
  std::
  vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
  ::~vector((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
             *)in_stack_fffffffffffff8d0);
  iVar2 = helper::Comm::Size((Comm *)0xa896b8);
  std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffff908 >> 0x20));
  std::operator+((char *)in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
  std::__cxx11::string::~string(local_1f0);
  profiling::JSONProfiler::AddTimerWatch
            (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,(bool)trace);
  iVar3 = helper::Comm::Size((Comm *)0xa89739);
  rankDestination = (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20);
  if (1 < iVar3) {
    std::__cxx11::string::string(local_210,local_1d0);
    profiling::JSONProfiler::Start
              ((JSONProfiler *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
    std::__cxx11::string::~string(local_210);
    local_230.field_2._8_8_ =
         std::vector<char,_std::allocator<char>_>::size
                   ((vector<char,_std::allocator<char>_> *)(local_f9 + 0x99));
    helper::Comm::GatherValues<unsigned_long>
              ((Comm *)in_stack_fffffffffffff8f8,(unsigned_long)in_stack_fffffffffffff8f0,
               (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20));
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0xa897ed);
    iVar3 = helper::Comm::Rank((Comm *)0xa89801);
    rankDestination = (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20);
    if (iVar3 == 0) {
      local_250 = 0;
      local_258 = &local_230;
      local_260._M_current =
           (unsigned_long *)
           std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
      local_268 = (unsigned_long *)
                  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)in_stack_fffffffffffff8c0,
                           (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                            *)this_00);
        rankDestination = (int)((ulong)in_stack_fffffffffffff8e8 >> 0x20);
        if (!bVar1) break;
        local_270 = __gnu_cxx::
                    __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                    ::operator*(&local_260);
        local_250 = *local_270 + local_250;
        __gnu_cxx::
        __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
        ::operator++(&local_260);
      }
      std::vector<char,_std::allocator<char>_>::resize
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff8e0,
                 (size_type)in_stack_fffffffffffff8d8);
    }
    in_stack_fffffffffffff9c0 = (JSONProfiler *)(in_RDI + 0x77);
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0xa89a7c);
    in_stack_fffffffffffff9b8 = &local_230;
    in_stack_fffffffffffff9d0 = local_230.field_2._8_8_;
    in_stack_fffffffffffff9d8 =
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa89aa9);
    in_stack_fffffffffffff9e0 =
         (BP5Writer *)
         std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                   ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                    in_stack_fffffffffffff9b8);
    std::vector<char,_std::allocator<char>_>::data((vector<char,_std::allocator<char>_> *)0xa89ad3);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              ((ulong)this_00 & 0xffffffff00000000);
    helper::Comm::GathervArrays<char>
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
               in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
               in_stack_fffffffffffffaa0);
    trace = (undefined1)
            ((ulong)&in_RDI[0x7a].
                     super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage >> 0x38);
    std::__cxx11::string::string(local_290,local_1d0);
    profiling::JSONProfiler::Stop(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
    std::__cxx11::string::~string(local_290);
    iVar3 = helper::Comm::Rank((Comm *)0xa89b73);
    if (iVar3 == 0) {
      std::
      vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::vector((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                *)0xa89b99);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa89ba6);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa89bb3);
      std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::vector
                ((vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)0xa89bc0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff908)
      ;
      in_stack_fffffffffffff8c0 = local_2d8;
      adios2::format::BP5Serializer::BreakoutContiguousMetadata
                (this_01,Aggregate,Counts,UniqueMetaMetaBlocks_00,
                 (vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)
                 CONCAT44(iVar2,in_stack_fffffffffffffa08),
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)MetaDataBlocks);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8d0)
      ;
      std::vector<char,_std::allocator<char>_>::clear
                ((vector<char,_std::allocator<char>_> *)0xa89c58);
      std::
      vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::vector((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                *)CONCAT44(in_stack_fffffffffffff914,in_stack_fffffffffffff910),
               in_stack_fffffffffffff908);
      this_00 = local_2d8;
      adios2::format::BP5Serializer::CopyMetadataToContiguous
                (in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                 in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,in_stack_fffffffffffffbd0);
      std::vector<char,_std::allocator<char>_>::operator=
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff8d0,
                 in_stack_fffffffffffff8c8);
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff8d0);
      std::
      vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::~vector((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                 *)in_stack_fffffffffffff8d0);
      std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~vector
                (in_stack_fffffffffffff8d0);
      std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~vector
                (in_stack_fffffffffffff8d0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8d0)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8d0)
      ;
      std::
      vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::~vector((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                 *)in_stack_fffffffffffff8d0);
    }
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff8d0);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8d0);
  }
  __val = (int)((ulong)in_stack_fffffffffffff908 >> 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_370,"ES_meta1",&local_371);
  profiling::JSONProfiler::Stop(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string(local_370);
  std::allocator<char>::~allocator((allocator<char> *)&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_398,"ES_meta2",&local_399);
  profiling::JSONProfiler::Start
            ((JSONProfiler *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
  std::__cxx11::string::~string(local_398);
  std::allocator<char>::~allocator((allocator<char> *)&local_399);
  iVar3 = helper::Comm::Rank((Comm *)0xa89f5b);
  if (iVar3 == 0) {
    std::vector<char,_std::allocator<char>_>::vector
              ((vector<char,_std::allocator<char>_> *)0xa89f81);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa89f8e);
    local_3e0 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)(local_f9 + 0x99));
    helper::Comm::Size((Comm *)0xa89fb7);
    std::__cxx11::to_string(__val);
    std::operator+((char *)in_stack_fffffffffffff8c8,in_stack_fffffffffffff8c0);
    std::__cxx11::string::~string(local_420);
    profiling::JSONProfiler::AddTimerWatch
              (in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,(bool)trace);
    iVar3 = helper::Comm::Size((Comm *)0xa8a038);
    if (iVar3 < 2) {
      local_3c0 = (vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                   *)(local_f9 + 0x99);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8d0,
                 (value_type *)in_stack_fffffffffffff8c8);
    }
    else {
      std::__cxx11::string::string(local_440,local_400);
      profiling::JSONProfiler::Start
                ((JSONProfiler *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
      std::__cxx11::string::~string(local_440);
      helper::Comm::GatherValues<unsigned_long>
                ((Comm *)in_stack_fffffffffffff8f8,(unsigned_long)in_stack_fffffffffffff8f0,
                 rankDestination);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8d0,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8c8)
      ;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8d0)
      ;
      iVar3 = helper::Comm::Rank((Comm *)0xa8a108);
      if (iVar3 == 0) {
        local_470._M_current =
             (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
        local_478 = (unsigned_long *)
                    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_00);
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)in_stack_fffffffffffff8c0,
                                  (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                                   *)this_00), bVar1) {
          local_480 = __gnu_cxx::
                      __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                      ::operator*(&local_470);
          __gnu_cxx::
          __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
          ::operator++(&local_470);
        }
        std::vector<char,_std::allocator<char>_>::resize
                  ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff8e0,
                   (size_type)in_stack_fffffffffffff8d8);
      }
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0xa8a30d);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa8a334);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&local_3d8);
      std::vector<char,_std::allocator<char>_>::data
                ((vector<char,_std::allocator<char>_> *)0xa8a35b);
      helper::Comm::GathervArrays<char>
                (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                 in_stack_fffffffffffffa78,in_stack_fffffffffffffa70,in_stack_fffffffffffffa68,
                 in_stack_fffffffffffffaa0);
      local_3c0 = &local_3b8;
      std::__cxx11::string::string(local_4a0,local_400);
      profiling::JSONProfiler::Stop(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
      std::__cxx11::string::~string(local_4a0);
    }
    iVar3 = helper::Comm::Rank((Comm *)0xa8a450);
    if (iVar3 == 0) {
      std::
      vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::vector((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                *)0xa8a470);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0xa8a47d);
      std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::vector
                ((vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)0xa8a48a);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8e0,
                 (size_type)in_stack_fffffffffffff8d8);
      in_stack_fffffffffffff900 =
           (JSONProfiler *)
           &in_RDI[0x1b].
            super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>._M_impl.
            super__Vector_impl_data._M_finish;
      __x = local_3c0;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                 CONCAT44(iVar3,in_stack_fffffffffffff910),
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_3c0);
      adios2::format::BP5Serializer::BreakoutContiguousMetadata
                (this_01,Aggregate,Counts,UniqueMetaMetaBlocks_00,
                 (vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_> *)
                 CONCAT44(iVar2,in_stack_fffffffffffffa08),
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_RDI,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)MetaDataBlocks);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8d0)
      ;
      std::
      vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::vector((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                *)CONCAT44(iVar3,in_stack_fffffffffffff910),__x);
      WriteMetaMetadata(in_stack_fffffffffffff8e0,
                        (vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                         *)in_stack_fffffffffffff8d8);
      std::
      vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::~vector((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                 *)in_stack_fffffffffffff8d0);
      in_RDI[0x88].super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
      _M_impl.super__Vector_impl_data._M_finish =
           in_RDI[0x80].
           super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>._M_impl.
           super__Vector_impl_data._M_finish;
      in_stack_fffffffffffff8f8 = (string *)local_551;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_551 + 1),"ES_write_metadata",
                 (allocator *)in_stack_fffffffffffff8f8);
      profiling::JSONProfiler::Start
                ((JSONProfiler *)in_stack_fffffffffffff8e0,in_stack_fffffffffffff8d8);
      std::__cxx11::string::~string((string *)(local_551 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_551);
      piVar5 = (pointer)WriteMetadata(this_02,(vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>
                                               *)MetaDataBlocks,in_RDI);
      in_RDI[0x88].super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = piVar5;
      paVar6 = (allocator *)&stack0xfffffffffffffa87;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&stack0xfffffffffffffa88,"ES_write_metadata",paVar6);
      profiling::JSONProfiler::Stop(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffa88);
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffa87);
      if (*(int *)((long)&in_RDI[0x12].
                          super__Vector_base<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>
                          ._M_impl.super__Vector_impl_data._M_finish + 4) == 0) {
        WriteMetadataFileIndex
                  (in_stack_fffffffffffff9e0,(uint64_t)in_stack_fffffffffffff9d8,
                   in_stack_fffffffffffff9d0);
      }
      std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~vector
                (in_stack_fffffffffffff8d0);
      std::vector<adios2::core::iovec,_std::allocator<adios2::core::iovec>_>::~vector
                (in_stack_fffffffffffff8d0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8d0)
      ;
      std::
      vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
      ::~vector((vector<adios2::format::BP5Base::MetaMetaInfoBlock,_std::allocator<adios2::format::BP5Base::MetaMetaInfoBlock>_>
                 *)in_stack_fffffffffffff8d0);
    }
    std::__cxx11::string::~string(local_400);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffff8d0);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffff8d0);
  }
  paVar6 = &local_5a1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a0,"ES_meta2",paVar6);
  profiling::JSONProfiler::Stop(in_stack_fffffffffffff900,in_stack_fffffffffffff8f8);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a1);
  std::__cxx11::string::~string(local_1d0);
  std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)paVar6);
  return;
}

Assistant:

void BP5Writer::TwoLevelAggregationMetadata(format::BP5Serializer::TimestepInfo TSInfo)
{
    /*
     * Two-step metadata aggregation
     */
    m_Profiler.Start("ES_meta1");
    std::vector<char> MetaBuffer;
    core::iovec m{TSInfo.MetaEncodeBuffer->Data(), TSInfo.MetaEncodeBuffer->m_FixedSize};
    core::iovec a{nullptr, 0};
    if (TSInfo.AttributeEncodeBuffer)
    {
        a = {TSInfo.AttributeEncodeBuffer->Data(), TSInfo.AttributeEncodeBuffer->m_FixedSize};
    }
    MetaBuffer = m_BP5Serializer.CopyMetadataToContiguous(
        TSInfo.NewMetaMetaBlocks, {m}, {a}, {m_ThisTimestepDataSize}, {m_StartDataPos});

    std::string meta1_gather_str =
        "ES_meta1_gather_" + std::to_string(m_AggregatorMetadata.m_Comm.Size());
    m_Profiler.AddTimerWatch(meta1_gather_str, true);

    if (m_AggregatorMetadata.m_Comm.Size() > 1)
    { // level 1
        m_Profiler.Start(meta1_gather_str);
        size_t LocalSize = MetaBuffer.size();
        std::vector<size_t> RecvCounts = m_AggregatorMetadata.m_Comm.GatherValues(LocalSize, 0);
        std::vector<char> RecvBuffer;
        if (m_AggregatorMetadata.m_Comm.Rank() == 0)
        {
            uint64_t TotalSize = 0;
            for (auto &n : RecvCounts)
                TotalSize += n;
            RecvBuffer.resize(TotalSize);
        }
        m_AggregatorMetadata.m_Comm.GathervArrays(MetaBuffer.data(), LocalSize, RecvCounts.data(),
                                                  RecvCounts.size(), RecvBuffer.data(), 0);
        m_Profiler.Stop(meta1_gather_str);
        if (m_AggregatorMetadata.m_Comm.Rank() == 0)
        {
            std::vector<format::BP5Base::MetaMetaInfoBlock> UniqueMetaMetaBlocks;
            std::vector<uint64_t> DataSizes;
            std::vector<uint64_t> WriterDataPositions;
            std::vector<core::iovec> AttributeBlocks;
            auto Metadata = m_BP5Serializer.BreakoutContiguousMetadata(
                RecvBuffer, RecvCounts, UniqueMetaMetaBlocks, AttributeBlocks, DataSizes,
                WriterDataPositions);

            MetaBuffer.clear();
            MetaBuffer = m_BP5Serializer.CopyMetadataToContiguous(
                UniqueMetaMetaBlocks, Metadata, AttributeBlocks, DataSizes, WriterDataPositions);
        }
    } // level 1
    m_Profiler.Stop("ES_meta1");
    m_Profiler.Start("ES_meta2");
    // level 2
    if (m_AggregatorMetadata.m_Comm.Rank() == 0)
    {
        std::vector<char> RecvBuffer;
        std::vector<char> *buf;
        std::vector<size_t> RecvCounts;
        size_t LocalSize = MetaBuffer.size();
        std::string meta2_gather_str =
            "ES_meta2_gather_" + std::to_string(m_CommMetadataAggregators.Size());
        m_Profiler.AddTimerWatch(meta2_gather_str, true);
        if (m_CommMetadataAggregators.Size() > 1)
        {
            m_Profiler.Start(meta2_gather_str);
            RecvCounts = m_CommMetadataAggregators.GatherValues(LocalSize, 0);
            if (m_CommMetadataAggregators.Rank() == 0)
            {
                uint64_t TotalSize = 0;
                for (auto &n : RecvCounts)
                    TotalSize += n;
                RecvBuffer.resize(TotalSize);
                /*std::cout << "MD Lvl-2: rank " << m_Comm.Rank() << " gather "
                          << TotalSize << " bytes from aggregator group"
                          << std::endl;*/
            }

            m_CommMetadataAggregators.GathervArrays(MetaBuffer.data(), LocalSize, RecvCounts.data(),
                                                    RecvCounts.size(), RecvBuffer.data(), 0);
            buf = &RecvBuffer;
            m_Profiler.Stop(meta2_gather_str);
        }
        else
        {
            buf = &MetaBuffer;
            RecvCounts.push_back(LocalSize);
        }

        if (m_CommMetadataAggregators.Rank() == 0)
        {
            std::vector<format::BP5Base::MetaMetaInfoBlock> UniqueMetaMetaBlocks;
            std::vector<uint64_t> DataSizes;
            std::vector<core::iovec> AttributeBlocks;
            m_WriterDataPos.resize(0);
            auto Metadata = m_BP5Serializer.BreakoutContiguousMetadata(
                *buf, RecvCounts, UniqueMetaMetaBlocks, AttributeBlocks, DataSizes,
                m_WriterDataPos);
            assert(m_WriterDataPos.size() == static_cast<size_t>(m_Comm.Size()));
            WriteMetaMetadata(UniqueMetaMetaBlocks);
            m_LatestMetaDataPos = m_MetaDataPos;
            m_Profiler.Start("ES_write_metadata");
            m_LatestMetaDataSize = WriteMetadata(Metadata, AttributeBlocks);
            m_Profiler.Stop("ES_write_metadata");
            if (!m_Parameters.AsyncWrite)
            {
                WriteMetadataFileIndex(m_LatestMetaDataPos, m_LatestMetaDataSize);
            }
        }
    } // level 2
    m_Profiler.Stop("ES_meta2");
}